

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_join.cpp
# Opt level: O3

vector<duckdb::ColumnBinding,_true> * __thiscall
duckdb::LogicalJoin::GetColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,LogicalJoin *this)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  byte bVar1;
  reference pvVar2;
  pointer pLVar3;
  vector<duckdb::ColumnBinding,_true> local_78;
  vector<duckdb::ColumnBinding,_true> local_58;
  vector<duckdb::ColumnBinding,_true> local_38;
  
  this_00 = &(this->super_LogicalOperator).children;
  pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar2);
  (*pLVar3->_vptr_LogicalOperator[2])(&local_58,pLVar3);
  LogicalOperator::MapBindings(&local_78,&local_58,&this->left_projection_map);
  if ((void *)CONCAT44(local_58.
                       super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_58.
                       super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_58.
                                     super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                     .
                                     super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_58.
                                     super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                     .
                                     super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  bVar1 = (this->super_LogicalOperator).field_0x61;
  if (1 < bVar1 - 5) {
    if (bVar1 != 7) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
               ::operator[](this_00,1);
      pLVar3 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(pvVar2);
      (*pLVar3->_vptr_LogicalOperator[2])(&local_38,pLVar3);
      LogicalOperator::MapBindings(&local_58,&local_38,&this->right_projection_map);
      if (local_38.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.
                        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((byte)((this->super_LogicalOperator).field_0x61 - 9) < 2) {
        (__return_storage_ptr__->
        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_58.
                               super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               .
                               super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,
                               local_58.
                               super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               .
                               super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_4_);
        (__return_storage_ptr__->
        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_58.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->
        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_58.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::ColumnBinding*,std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>>>
                  ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)&local_78,
                   local_78.
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   CONCAT44(local_58.
                            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            .
                            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_58.
                            super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            .
                            super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_),
                   local_58.
                   super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                   super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        (__return_storage_ptr__->
        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (__return_storage_ptr__->
        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        (__return_storage_ptr__->
        super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
        super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if ((void *)CONCAT44(local_58.
                             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             .
                             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                             local_58.
                             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             .
                             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                             ._M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
          operator_delete((void *)CONCAT44(local_58.
                                           super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                           .
                                           super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                           ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                           local_58.
                                           super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                           .
                                           super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                           ._M_impl.super__Vector_impl_data._M_start._0_4_));
        }
      }
      if (local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
          super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_78.
                      super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
                      super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
    local_58.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
    emplace_back<unsigned_long&,int>
              ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)&local_78,
               &this->mark_index,(int *)&local_58);
  }
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
  super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_78.super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalJoin::GetColumnBindings() {
	auto left_bindings = MapBindings(children[0]->GetColumnBindings(), left_projection_map);
	if (join_type == JoinType::SEMI || join_type == JoinType::ANTI) {
		// for SEMI and ANTI join we only project the left hand side
		return left_bindings;
	}

	if (join_type == JoinType::MARK) {
		// for MARK join we project the left hand side plus the MARK column
		left_bindings.emplace_back(mark_index, 0);
		return left_bindings;
	}
	// for other join types we project both the LHS and the RHS
	auto right_bindings = MapBindings(children[1]->GetColumnBindings(), right_projection_map);
	if (join_type == JoinType::RIGHT_SEMI || join_type == JoinType::RIGHT_ANTI) {
		return right_bindings;
	}
	left_bindings.insert(left_bindings.end(), right_bindings.begin(), right_bindings.end());
	return left_bindings;
}